

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

bool __thiscall
tcu::TestSessionExecutor::enterTestCase
          (TestSessionExecutor *this,TestCase *testCase,string *casePath)

{
  TestNodeType nodeType;
  qpTestCaseType testCaseType;
  TestLog *this_00;
  undefined8 uVar1;
  char *testCasePath;
  deUint64 dVar2;
  TestCaseExecutor *pTVar3;
  bad_alloc *anon_var_0;
  TestException *e;
  Exception *e_1;
  bool initOk;
  qpTestCaseType caseType;
  TestLog *log;
  string *casePath_local;
  TestCase *testCase_local;
  TestSessionExecutor *this_local;
  
  this_00 = TestContext::getLog(this->m_testCtx);
  nodeType = TestNode::getNodeType(&testCase->super_TestNode);
  testCaseType = nodeTypeToTestCaseType(nodeType);
  uVar1 = std::__cxx11::string::c_str();
  print("\nTest case \'%s\'..\n",uVar1);
  TestContext::setTestResult(this->m_testCtx,QP_TEST_RESULT_LAST,"");
  TestContext::setTerminateAfter(this->m_testCtx,false);
  testCasePath = (char *)std::__cxx11::string::c_str();
  TestLog::startCase(this_00,testCasePath,testCaseType);
  this->m_isInTestCase = true;
  dVar2 = deGetMicroseconds();
  this->m_testStartTime = dVar2;
  pTVar3 = de::details::
           UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::operator->
                     (&(this->m_caseExecutor).
                       super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                     );
  (*pTVar3->_vptr_TestCaseExecutor[2])(pTVar3,testCase,casePath);
  return true;
}

Assistant:

bool TestSessionExecutor::enterTestCase (TestCase* testCase, const std::string& casePath)
{
	TestLog&				log			= m_testCtx.getLog();
	const qpTestCaseType	caseType	= nodeTypeToTestCaseType(testCase->getNodeType());
	bool					initOk		= false;

	print("\nTest case '%s'..\n", casePath.c_str());

	m_testCtx.setTestResult(QP_TEST_RESULT_LAST, "");
	m_testCtx.setTerminateAfter(false);
	log.startCase(casePath.c_str(), caseType);

	m_isInTestCase	= true;
	m_testStartTime	= deGetMicroseconds();

	try
	{
		m_caseExecutor->init(testCase, casePath);
		initOk = true;
	}
	catch (const std::bad_alloc&)
	{
		DE_ASSERT(!initOk);
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Failed to allocate memory in test case init");
		m_testCtx.setTerminateAfter(true);
	}
	catch (const tcu::TestException& e)
	{
		DE_ASSERT(!initOk);
		DE_ASSERT(e.getTestResult() != QP_TEST_RESULT_LAST);
		m_testCtx.setTestResult(e.getTestResult(), e.getMessage());
		m_testCtx.setTerminateAfter(e.isFatal());
		log << e;
	}
	catch (const tcu::Exception& e)
	{
		DE_ASSERT(!initOk);
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
		log << e;
	}

	DE_ASSERT(initOk || m_testCtx.getTestResult() != QP_TEST_RESULT_LAST);

	return initOk;
}